

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O1

CURLcode Curl_ws_request(Curl_easy *data,dynbuf *req)

{
  char *__s;
  CURLcode CVar1;
  size_t thislen;
  char *pcVar2;
  char **ppcVar3;
  ulong uVar4;
  bool bVar5;
  char *randstr;
  size_t randlen;
  uchar rand [16];
  wsfield heads [4];
  char keyval [40];
  char *local_b8;
  ulong local_b0;
  uchar local_a8 [16];
  char *local_98 [5];
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  char local_58 [40];
  
  local_68 = "Sec-WebSocket-Key";
  local_98[4] = "Sec-WebSocket-Version";
  pcStack_70 = "13";
  local_98[2] = "Connection";
  local_98[3] = "Upgrade";
  local_98[0] = "Upgrade";
  local_98[1] = "websocket";
  pcStack_60 = local_58;
  CVar1 = Curl_rand_bytes(data,local_a8,0x10);
  if ((CVar1 == CURLE_OK) &&
     (CVar1 = Curl_base64_encode((char *)local_a8,0x10,&local_b8,&local_b0), CVar1 == CURLE_OK)) {
    if (local_b0 < 0x28) {
      strcpy(local_58,local_b8);
      (*Curl_cfree)(local_b8);
      ppcVar3 = local_98 + 1;
      CVar1 = CURLE_OK;
      uVar4 = 0;
      do {
        __s = ppcVar3[-1];
        thislen = strlen(__s);
        pcVar2 = Curl_checkheaders(data,__s,thislen);
        if (pcVar2 == (char *)0x0) {
          CVar1 = Curl_dyn_addf(req,"%s: %s\r\n",__s,*ppcVar3);
        }
        if (CVar1 != CURLE_OK) break;
        ppcVar3 = ppcVar3 + 2;
        bVar5 = uVar4 < 3;
        uVar4 = uVar4 + 1;
      } while (bVar5);
      (data->req).upgr101 = UPGR101_WS;
    }
    else {
      (*Curl_cfree)(local_b8);
      CVar1 = CURLE_FAILED_INIT;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ws_request(struct Curl_easy *data, struct dynbuf *req)
{
  unsigned int i;
  CURLcode result = CURLE_OK;
  unsigned char rand[16];
  char *randstr;
  size_t randlen;
  char keyval[40];
  struct SingleRequest *k = &data->req;
  struct wsfield heads[]= {
    {
      /* The request MUST contain an |Upgrade| header field whose value
         MUST include the "websocket" keyword. */
      "Upgrade", "websocket"
    },
    {
      /* The request MUST contain a |Connection| header field whose value
         MUST include the "Upgrade" token. */
      "Connection", "Upgrade",
    },
    {
      /* The request MUST include a header field with the name
         |Sec-WebSocket-Version|. The value of this header field MUST be
         13. */
      "Sec-WebSocket-Version", "13",
    },
    {
      /* The request MUST include a header field with the name
         |Sec-WebSocket-Key|. The value of this header field MUST be a nonce
         consisting of a randomly selected 16-byte value that has been
         base64-encoded (see Section 4 of [RFC4648]). The nonce MUST be
         selected randomly for each connection. */
      "Sec-WebSocket-Key", NULL,
    }
  };
  heads[3].val = &keyval[0];

  /* 16 bytes random */
  result = Curl_rand(data, (unsigned char *)rand, sizeof(rand));
  if(result)
    return result;
  result = Curl_base64_encode((char *)rand, sizeof(rand), &randstr, &randlen);
  if(result)
    return result;
  DEBUGASSERT(randlen < sizeof(keyval));
  if(randlen >= sizeof(keyval)) {
    free(randstr);
    return CURLE_FAILED_INIT;
  }
  strcpy(keyval, randstr);
  free(randstr);
  for(i = 0; !result && (i < CURL_ARRAYSIZE(heads)); i++) {
    if(!Curl_checkheaders(data, heads[i].name, strlen(heads[i].name))) {
      result = Curl_dyn_addf(req, "%s: %s\r\n", heads[i].name,
                             heads[i].val);
    }
  }
  k->upgr101 = UPGR101_WS;
  return result;
}